

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O0

int archive_write_zip_close(archive_write *a)

{
  long lVar1;
  long lVar2;
  int iVar3;
  long in_RDI;
  int ret;
  cd_segment *segment;
  zip_conflict *zip;
  int64_t offset_end;
  int64_t offset_start;
  uint8_t buff [64];
  void *in_stack_ffffffffffffff38;
  archive_write *in_stack_ffffffffffffff40;
  archive_write *a_00;
  uint32_t local_b0;
  uint16_t local_a0;
  uint16_t local_90;
  undefined8 *local_78;
  undefined4 local_58;
  undefined1 auStack_54 [4];
  undefined1 auStack_50 [2];
  undefined1 auStack_4e [2];
  undefined1 auStack_4c [2];
  undefined1 auStack_4a [2];
  undefined1 auStack_48 [68];
  int local_4;
  
  lVar1 = *(long *)(in_RDI + 0xd0);
  a_00 = *(archive_write **)(lVar1 + 0x88);
  for (local_78 = *(undefined8 **)(lVar1 + 0x68); local_78 != (undefined8 *)0x0;
      local_78 = (undefined8 *)*local_78) {
    iVar3 = __archive_write_output(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,0x1ab5f9);
    if (iVar3 != 0) {
      return -0x1e;
    }
    *(long *)(lVar1 + 0x88) = (local_78[3] - local_78[2]) + *(long *)(lVar1 + 0x88);
  }
  lVar2 = *(long *)(lVar1 + 0x88);
  if ((((0xffffffff < lVar2 - (long)a_00) || (0xffffffff < (long)a_00)) ||
      (0xffff < *(ulong *)(lVar1 + 0x80))) || ((*(uint *)(lVar1 + 0xa8) & 2) != 0)) {
    memset(&local_58,0,0x38);
    local_58 = 0x6064b50;
    archive_le64enc(in_stack_ffffffffffffff40,(uint64_t)in_stack_ffffffffffffff38);
    archive_le16enc(auStack_4c,0x2d);
    archive_le16enc(auStack_4a,0x2d);
    archive_le64enc(in_stack_ffffffffffffff40,(uint64_t)in_stack_ffffffffffffff38);
    archive_le64enc(in_stack_ffffffffffffff40,(uint64_t)in_stack_ffffffffffffff38);
    archive_le64enc(in_stack_ffffffffffffff40,(uint64_t)in_stack_ffffffffffffff38);
    archive_le64enc(in_stack_ffffffffffffff40,(uint64_t)in_stack_ffffffffffffff38);
    iVar3 = __archive_write_output(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,0x1ab772);
    if (iVar3 != 0) {
      return -0x1e;
    }
    *(long *)(lVar1 + 0x88) = *(long *)(lVar1 + 0x88) + 0x38;
    memset(&local_58,0,0x14);
    local_58 = 0x7064b50;
    archive_le32enc(auStack_54,0);
    archive_le64enc(in_stack_ffffffffffffff40,(uint64_t)in_stack_ffffffffffffff38);
    archive_le32enc(auStack_48,1);
    iVar3 = __archive_write_output(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,0x1ab80c);
    if (iVar3 != 0) {
      return -0x1e;
    }
    *(long *)(lVar1 + 0x88) = *(long *)(lVar1 + 0x88) + 0x14;
  }
  memset(&local_58,0,0x40);
  local_58 = 0x6054b50;
  if (*(ulong *)(lVar1 + 0x80) < 0xffff) {
    local_90 = (uint16_t)*(undefined8 *)(lVar1 + 0x80);
  }
  else {
    local_90 = 0xffff;
  }
  archive_le16enc(auStack_50,local_90);
  if (*(ulong *)(lVar1 + 0x80) < 0xffff) {
    local_a0 = (uint16_t)*(undefined8 *)(lVar1 + 0x80);
  }
  else {
    local_a0 = 0xffff;
  }
  archive_le16enc(auStack_4e,local_a0);
  if (lVar2 - (long)a_00 < 0xffffffff) {
    local_b0 = (int)lVar2 - (int)a_00;
  }
  else {
    local_b0 = 0xffffffff;
  }
  archive_le32enc(auStack_4c,local_b0);
  if (0xfffffffe < (long)a_00) {
    a_00 = (archive_write *)0xffffffff;
  }
  archive_le32enc(auStack_48,(uint32_t)a_00);
  iVar3 = __archive_write_output(a_00,in_stack_ffffffffffffff38,0x1ab9a7);
  if (iVar3 == 0) {
    *(long *)(lVar1 + 0x88) = *(long *)(lVar1 + 0x88) + 0x16;
    local_4 = 0;
  }
  else {
    local_4 = -0x1e;
  }
  return local_4;
}

Assistant:

static int
archive_write_zip_close(struct archive_write *a)
{
	uint8_t buff[64];
	int64_t offset_start, offset_end;
	struct zip *zip = a->format_data;
	struct cd_segment *segment;
	int ret;

	offset_start = zip->written_bytes;
	segment = zip->central_directory;
	while (segment != NULL) {
		ret = __archive_write_output(a,
		    segment->buff, segment->p - segment->buff);
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		zip->written_bytes += segment->p - segment->buff;
		segment = segment->next;
	}
	offset_end = zip->written_bytes;

	/* If central dir info is too large, write Zip64 end-of-cd */
	if (offset_end - offset_start > 0xffffffffLL
	    || offset_start > 0xffffffffLL
	    || zip->central_directory_entries > 0xffffUL
	    || (zip->flags & ZIP_FLAG_FORCE_ZIP64)) {
	  /* Zip64 end-of-cd record */
	  memset(buff, 0, 56);
	  memcpy(buff, "PK\006\006", 4);
	  archive_le64enc(buff + 4, 44);
	  archive_le16enc(buff + 12, 45);
	  archive_le16enc(buff + 14, 45);
	  /* This is disk 0 of 0. */
	  archive_le64enc(buff + 24, zip->central_directory_entries);
	  archive_le64enc(buff + 32, zip->central_directory_entries);
	  archive_le64enc(buff + 40, offset_end - offset_start);
	  archive_le64enc(buff + 48, offset_start);
	  ret = __archive_write_output(a, buff, 56);
	  if (ret != ARCHIVE_OK)
		  return (ARCHIVE_FATAL);
	  zip->written_bytes += 56;

	  /* Zip64 end-of-cd locator record. */
	  memset(buff, 0, 20);
	  memcpy(buff, "PK\006\007", 4);
	  archive_le32enc(buff + 4, 0);
	  archive_le64enc(buff + 8, offset_end);
	  archive_le32enc(buff + 16, 1);
	  ret = __archive_write_output(a, buff, 20);
	  if (ret != ARCHIVE_OK)
		  return (ARCHIVE_FATAL);
	  zip->written_bytes += 20;

	}

	/* Format and write end of central directory. */
	memset(buff, 0, sizeof(buff));
	memcpy(buff, "PK\005\006", 4);
	archive_le16enc(buff + 8, zipmin(0xffffU, zip->central_directory_entries));
	archive_le16enc(buff + 10, zipmin(0xffffU, zip->central_directory_entries));
	archive_le32enc(buff + 12, (uint32_t)zipmin(0xffffffffLL, (offset_end - offset_start)));
	archive_le32enc(buff + 16, (uint32_t)zipmin(0xffffffffLL, offset_start));
	ret = __archive_write_output(a, buff, 22);
	if (ret != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	zip->written_bytes += 22;
	return (ARCHIVE_OK);
}